

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O1

ConstTestNodeIterator * __thiscall
xe::ConstTestNodeIterator::operator++(ConstTestNodeIterator *this)

{
  pointer *ppGVar1;
  pointer pGVar2;
  pointer pGVar3;
  iterator __position;
  TestGroup *pTVar4;
  ConstTestNodeIterator *pCVar5;
  pointer pGVar6;
  int iVar7;
  int iVar8;
  GroupState local_18;
  
  pGVar2 = (this->m_iterStack).
           super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar3 = (this->m_iterStack).
           super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar5 = this;
  if ((long)pGVar3 - (long)pGVar2 != 0x10) {
    pCVar5 = (ConstTestNodeIterator *)
             (((pGVar3[-1].group)->m_children).
              super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_start + pGVar3[-1].childNdx);
  }
  local_18.group = (TestGroup *)pCVar5->m_root;
  if ((((local_18.group)->super_TestNode).m_nodeType < TESTNODETYPE_TEST_CASE) &&
     (0 < (int)((ulong)((long)((local_18.group)->m_children).
                              super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)((local_18.group)->m_children).
                             super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3))) {
    local_18.childNdx = 0;
    __position._M_current =
         (this->m_iterStack).
         super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_iterStack).
        super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
      ::_M_realloc_insert<xe::ConstTestNodeIterator::GroupState>
                (&this->m_iterStack,__position,&local_18);
    }
    else {
      (__position._M_current)->group = local_18.group;
      *(ulong *)&(__position._M_current)->childNdx = (ulong)(uint)local_18._12_4_ << 0x20;
      ppGVar1 = &(this->m_iterStack).
                 super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppGVar1 = *ppGVar1 + 1;
    }
  }
  else {
    pGVar3 = (this->m_iterStack).
             super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      pGVar6 = pGVar3 + -1;
      pTVar4 = pGVar6->group;
      if (pTVar4 == (TestGroup *)0x0) {
        iVar7 = 1;
      }
      else {
        iVar7 = (int)((ulong)((long)(pTVar4->m_children).
                                    super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar4->m_children).
                                   super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      }
      iVar8 = pGVar3[-1].childNdx + 1;
      pGVar3[-1].childNdx = iVar8;
    } while ((iVar8 == iVar7) &&
            ((this->m_iterStack).
             super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
             ._M_impl.super__Vector_impl_data._M_finish = pGVar6, pGVar3 = pGVar6, pGVar6 != pGVar2)
            );
  }
  return this;
}

Assistant:

ConstTestNodeIterator& ConstTestNodeIterator::operator++ (void)
{
	DE_ASSERT(!m_iterStack.empty());

	const TestNode*	curNode			= **this;
	TestNodeType	curNodeType		= curNode->getNodeType();

	if ((curNodeType == TESTNODETYPE_GROUP || curNodeType == TESTNODETYPE_ROOT) &&
		static_cast<const TestGroup*>(curNode)->getNumChildren() > 0)
	{
		m_iterStack.push_back(GroupState(static_cast<const TestGroup*>(curNode)));
	}
	else
	{
		for (;;)
		{
			const TestGroup*	group		= m_iterStack.back().group;
			int&				childNdx	= m_iterStack.back().childNdx;
			int					numChildren	= group ? group->getNumChildren() : 1;

			childNdx += 1;
			if (childNdx == numChildren)
			{
				m_iterStack.pop_back();
				if (m_iterStack.empty())
					break;
			}
			else
				break;
		}
	}

	return *this;
}